

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O3

void printU12ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t val;
  undefined4 in_register_00000034;
  
  op = MCInst_getOperand(MI,2);
  val = MCOperand_getImm(op);
  printInt64((SStream *)CONCAT44(in_register_00000034,OpNum),val);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(int64_t *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1d) = val;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printU12ImmOperand(MCInst *MI, int OpNum, SStream *O)
{
	int64_t Value = MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(isUInt<12>(Value) && "Invalid u12imm argument");
	printInt64(O, Value);

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = Value;
		MI->flat_insn->detail->sysz.op_count++;
	}
}